

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O3

void emit_wrong_version(Dwarf_Debug dbg,Dwarf_Half version,Dwarf_Error *error)

{
  char *msg;
  undefined6 in_register_00000032;
  dwarfstring m;
  dwarfstring_s local_40;
  
  dwarfstring_constructor(&local_40);
  dwarfstring_append_printf_u
            (&local_40,
             "DW_DLE_STR_OFFSETS_VERSION_WRONG: %u. Only version 5 is supported when reading .debug_str_offsets. Perhaps the section is a GNU DWARF4 extension with a different format."
             ,CONCAT62(in_register_00000032,version) & 0xffffffff);
  msg = dwarfstring_string(&local_40);
  _dwarf_error_string(dbg,error,0x196,msg);
  dwarfstring_destructor(&local_40);
  return;
}

Assistant:

static void
emit_wrong_version(Dwarf_Debug dbg,
    Dwarf_Half version,
    Dwarf_Error *error)
{
    dwarfstring m;

    dwarfstring_constructor(&m);
    dwarfstring_append_printf_u(&m,
        "DW_DLE_STR_OFFSETS_VERSION_WRONG: "
        "%u. Only version 5 is supported "
        "when reading .debug_str_offsets."
        " Perhaps the section is a GNU DWARF4"
        " extension with a different format.",
        version);
    _dwarf_error_string(dbg,error,
        DW_DLE_STR_OFFSETS_VERSION_WRONG,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}